

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O2

int fits_get_url(fitsfile *fptr,char *realURL,char *startURL,char *realAccess,char *startAccess,
                int *iostate,int *status)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  undefined4 uVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  uint uVar8;
  char tmpStr3 [1025];
  char tmpStr1 [1025];
  char tmpStr4 [1025];
  char tmpStr2 [1025];
  char outfile [1025];
  char infile [1025];
  
  if (*status != 0) {
    return *status;
  }
  tmpStr4._0_8_ = tmpStr4._0_8_ & 0xffffffffffffff00;
  tmpStr3._0_8_ = tmpStr3._0_8_ & 0xffffffffffffff00;
  tmpStr2[0] = '\0';
  tmpStr1[0] = '\0';
  iVar5 = ffflnm(fptr,tmpStr1,status);
  *status = iVar5;
  iVar5 = ffiurl(tmpStr1,(char *)0x0,infile,outfile,(char *)0x0,tmpStr2,tmpStr3,tmpStr4,status);
  *status = iVar5;
  bVar2 = tmpStr3[0] != '\0';
  bVar3 = tmpStr2[0] != '\0';
  bVar1 = tmpStr4[0] != '\0';
  iVar5 = ffurlt(fptr,tmpStr3,status);
  *status = iVar5;
  strcpy(tmpStr4,tmpStr3);
  iVar5 = ffrtnm(tmpStr1,tmpStr2,status);
  *status = iVar5;
  strcpy(tmpStr1,tmpStr2);
  iVar5 = fits_strcasecmp(tmpStr3,"file://");
  if (iVar5 == 0) {
    if (outfile[0] == '\0') {
      tmpStr2[0] = '\0';
    }
    else {
      strcpy(tmpStr1,outfile);
    }
    pcVar7 = strstr(tmpStr1,"://");
    if (pcVar7 != (char *)0x0) {
      strcpy(infile,pcVar7 + 3);
      strcpy(tmpStr1,infile);
    }
    pcVar7 = strstr(tmpStr2,"://");
    if (pcVar7 != (char *)0x0) {
      strcpy(infile,pcVar7 + 3);
      strcpy(tmpStr2,infile);
    }
LAB_001b12ef:
    uVar8 = 1;
  }
  else {
    uVar8 = -(uint)((bVar2 || bVar3) || bVar1);
    iVar5 = fits_strcasecmp(tmpStr3,"mem://");
    if (iVar5 == 0) {
      if ((uVar8 & 1) != 0) {
        ffpmsg("cannot make URL from temp MEM:// file (fits_get_url)");
        *status = 0x7d;
        goto LAB_001b147c;
      }
LAB_001b12ca:
      tmpStr2[0] = '\0';
      goto LAB_001b12ef;
    }
    iVar5 = fits_strcasecmp(tmpStr3,"memkeep://");
    if (iVar5 == 0) {
      builtin_strncpy(tmpStr3,"mem://",7);
      uVar4 = tmpStr3._0_4_;
      tmpStr3._0_8_ = CONCAT44(tmpStr3._4_4_,uVar4);
      tmpStr4._0_8_ = tmpStr4._0_8_ & 0xffffffffffffff00;
      goto LAB_001b12ca;
    }
    iVar5 = fits_strcasecmp(tmpStr3,"shmem://");
    if (iVar5 == 0) {
      tmpStr4._0_8_ = tmpStr4._0_8_ & 0xffffffffffffff00;
      tmpStr2[0] = '\0';
      goto LAB_001b12ef;
    }
    iVar5 = fits_strcasecmp(tmpStr3,"root://");
    if (iVar5 == 0) {
      tmpStr4._0_8_ = tmpStr4._0_8_ & 0xffffffffffffff00;
      tmpStr2[0] = '\0';
      goto LAB_001b14fd;
    }
    iVar5 = fits_strcasecmp(tmpStr3,"compressfile://");
    if (iVar5 == 0) {
      strcpy(tmpStr1,outfile);
      strcpy(tmpStr2,infile);
      tmpStr4[0] = 'f';
      tmpStr4[1] = 'i';
      tmpStr4[2] = 'l';
      tmpStr4[3] = 'e';
      tmpStr4[4] = ':';
      tmpStr4[5] = '/';
      tmpStr4[6] = '/';
      tmpStr4[7] = '\0';
LAB_001b14f5:
      builtin_strncpy(tmpStr3,"file://",8);
LAB_001b14fd:
      uVar8 = 1;
    }
    else {
      iVar5 = fits_strcasecmp(tmpStr3,"httpfile://");
      if (iVar5 == 0) {
        strcpy(tmpStr1,outfile);
        tmpStr4[0] = 'h';
        tmpStr4[1] = 't';
        tmpStr4[2] = 't';
        tmpStr4[3] = 'p';
        tmpStr4[4] = ':';
        tmpStr4[5] = '/';
        tmpStr4[6] = '/';
        tmpStr4[7] = '\0';
        goto LAB_001b14f5;
      }
      iVar5 = fits_strcasecmp(tmpStr3,"ftpfile://");
      if (iVar5 == 0) {
        strcpy(tmpStr1,outfile);
        builtin_strncpy(tmpStr3,"file://",8);
        builtin_strncpy(tmpStr4,"ftp://",7);
        goto LAB_001b14fd;
      }
      iVar5 = fits_strcasecmp(tmpStr3,"stdinfile://");
      if (iVar5 == 0) {
        strcpy(tmpStr1,outfile);
        builtin_strncpy(tmpStr3,"file://",8);
        builtin_strncpy(tmpStr4,"stdin://",9);
        goto LAB_001b14fd;
      }
      iVar5 = fits_strcasecmp(tmpStr3,"compress://");
      if (iVar5 == 0) {
        tmpStr1[0] = '\0';
        strcpy(tmpStr2,infile);
        tmpStr4[0] = 'f';
        tmpStr4[1] = 'i';
        tmpStr4[2] = 'l';
        tmpStr4[3] = 'e';
        tmpStr4[4] = ':';
        tmpStr4[5] = '/';
        tmpStr4[6] = '/';
        tmpStr4[7] = '\0';
LAB_001b15e6:
        builtin_strncpy(tmpStr3,"mem://",7);
LAB_001b15ee:
        uVar8 = 0;
      }
      else {
        iVar5 = fits_strcasecmp(tmpStr3,"http://");
        if ((iVar5 == 0) || (iVar5 = fits_strcasecmp(tmpStr3,"httpcompress://"), iVar5 == 0)) {
          tmpStr1[0] = '\0';
          tmpStr4[0] = 'h';
          tmpStr4[1] = 't';
          tmpStr4[2] = 't';
          tmpStr4[3] = 'p';
          tmpStr4[4] = ':';
          tmpStr4[5] = '/';
          tmpStr4[6] = '/';
          tmpStr4[7] = '\0';
          goto LAB_001b15e6;
        }
        iVar5 = fits_strcasecmp(tmpStr3,"ftp://");
        if ((iVar5 == 0) || (iVar5 = fits_strcasecmp(tmpStr3,"ftpcompress://"), iVar5 == 0)) {
          tmpStr1[0] = '\0';
          builtin_strncpy(tmpStr3,"mem://",7);
          uVar4 = tmpStr3._0_4_;
          tmpStr3._0_8_ = CONCAT44(tmpStr3._4_4_,uVar4);
          builtin_strncpy(tmpStr4,"ftp://",7);
          uVar4 = tmpStr4._0_4_;
          tmpStr4._0_8_ = CONCAT44(tmpStr4._4_4_,uVar4);
          goto LAB_001b15ee;
        }
        iVar5 = fits_strcasecmp(tmpStr3,"stdin://");
        if (iVar5 == 0) {
          *status = 0x7d;
          pcVar7 = "cannot make valid URL from stdin:// (fits_get_url)";
LAB_001b163f:
          ffpmsg(pcVar7);
          tmpStr2[0] = '\0';
          tmpStr1[0] = '\0';
        }
        else {
          iVar5 = fits_strcasecmp(tmpStr3,"stdout://");
          if (iVar5 == 0) {
            *status = 0x7d;
            pcVar7 = "cannot make valid URL from stdout:// (fits_get_url)";
            goto LAB_001b163f;
          }
          iVar5 = fits_strcasecmp(tmpStr3,"irafmem://");
          if (iVar5 == 0) {
            *status = 0x7d;
            pcVar7 = "cannot make valid URL from irafmem:// (fits_get_url)";
            goto LAB_001b163f;
          }
        }
      }
    }
  }
  pcVar7 = tmpStr1;
  if (*status == 0) {
    if (realURL != (char *)0x0) {
      if (tmpStr1[0] == '\0') {
        *realURL = '\0';
      }
      else {
        pcVar6 = strstr(pcVar7,"://");
        if (pcVar6 == (char *)0x0) {
          iVar5 = 0;
        }
        else {
          pcVar7 = pcVar6 + 3;
          iVar5 = (int)pcVar7 - (int)tmpStr1;
          strncpy(realURL,tmpStr1,(long)iVar5);
        }
        iVar5 = fits_path2url(pcVar7,0x401 - iVar5,realURL + iVar5,status);
        *status = iVar5;
      }
    }
    pcVar7 = tmpStr2;
    if (startURL != (char *)0x0) {
      if (tmpStr2[0] == '\0') {
        *startURL = '\0';
      }
      else {
        pcVar6 = strstr(pcVar7,"://");
        if (pcVar6 == (char *)0x0) {
          iVar5 = 0;
        }
        else {
          pcVar7 = pcVar6 + 3;
          iVar5 = (int)pcVar7 - (int)tmpStr2;
          strncpy(startURL,tmpStr2,(long)iVar5);
        }
        iVar5 = fits_path2url(pcVar7,0x401 - iVar5,startURL + iVar5,status);
        *status = iVar5;
      }
    }
    if (realAccess != (char *)0x0) {
      strcpy(realAccess,tmpStr3);
    }
    if (startAccess != (char *)0x0) {
      strcpy(startAccess,tmpStr4);
    }
    if (iostate != (int *)0x0) {
      *iostate = uVar8;
    }
  }
LAB_001b147c:
  return *status;
}

Assistant:

int  fits_get_url(fitsfile *fptr,       /* I ptr to FITS file to evaluate    */
		  char     *realURL,    /* O URL of real FITS file           */
		  char     *startURL,   /* O URL of starting FITS file       */
		  char     *realAccess, /* O true access method of FITS file */
		  char     *startAccess,/* O "official" access of FITS file  */
		  int      *iostate,    /* O can this file be modified?      */
		  int      *status)
/*
  For grouping convention purposes, determine the URL of the FITS file
  associated with the fitsfile pointer fptr. The true access type (file://,
  mem://, shmem://, root://), starting "official" access type, and iostate 
  (0 ==> readonly, 1 ==> readwrite) are also returned.

  It is assumed that the url string has enough room to hold the resulting
  URL, and the the accessType string has enough room to hold the access type.
*/
{
  int i;
  int tmpIOstate = 0;

  char infile[FLEN_FILENAME];
  char outfile[FLEN_FILENAME];
  char tmpStr1[FLEN_FILENAME];
  char tmpStr2[FLEN_FILENAME];
  char tmpStr3[FLEN_FILENAME];
  char tmpStr4[FLEN_FILENAME];
  char *tmpPtr;


  if(*status != 0) return(*status);

  do
    {
      /* 
	 retrieve the member HDU's file name as opened by ffopen() 
	 and parse it into its constitutent pieces; get the currently
	 active driver token too
       */
	  
      *tmpStr1 = *tmpStr2 = *tmpStr3 = *tmpStr4 = 0;

      *status = fits_file_name(fptr,tmpStr1,status);

      *status = ffiurl(tmpStr1,NULL,infile,outfile,NULL,tmpStr2,tmpStr3,
		       tmpStr4,status);

      if((*tmpStr2) || (*tmpStr3) || (*tmpStr4)) tmpIOstate = -1;
 
      *status = ffurlt(fptr,tmpStr3,status);

      strcpy(tmpStr4,tmpStr3);

      *status = ffrtnm(tmpStr1,tmpStr2,status);
      strcpy(tmpStr1,tmpStr2);

      /*
	for grouping convention purposes (only) determine the URL of the
	actual FITS file being used for the given fptr, its true access 
	type (file://, mem://, shmem://, root://) and its iostate (0 ==>
	read only, 1 ==> readwrite)
      */

      /*
	The first set of access types are "simple" in that they do not
	use any redirection to temporary memory or outfiles
       */

      /* standard disk file driver is in use */
      
      if(fits_strcasecmp(tmpStr3,"file://")              == 0)         
	{
	  tmpIOstate = 1;
	  
	  if(strlen(outfile)) strcpy(tmpStr1,outfile);
	  else *tmpStr2 = 0;

	  /*
	    make sure no FILE:// specifier is given in the tmpStr1
	    or tmpStr2 strings; the convention calls for local files
	    to have no access specification
	  */

	  if((tmpPtr = strstr(tmpStr1,"://")) != NULL)
	    {
	      strcpy(infile,tmpPtr+3);
	      strcpy(tmpStr1,infile);
	    }

	  if((tmpPtr = strstr(tmpStr2,"://")) != NULL)
	    {
	      strcpy(infile,tmpPtr+3);
	      strcpy(tmpStr2,infile);
	    }
	}

      /* file stored in conventional memory */
	  
      else if(fits_strcasecmp(tmpStr3,"mem://")          == 0)          
	{
	  if(tmpIOstate < 0)
	    {
	      /* file is a temp mem file only */
	      ffpmsg("cannot make URL from temp MEM:// file (fits_get_url)");
	      *status = URL_PARSE_ERROR;
	    }
	  else
	    {
	      /* file is a "perminate" mem file for this process */
	      tmpIOstate = 1;
	      *tmpStr2 = 0;
	    }
	}

      /* file stored in conventional memory */
 
     else if(fits_strcasecmp(tmpStr3,"memkeep://")      == 0)      
	{
	  strcpy(tmpStr3,"mem://");
	  *tmpStr4 = 0;
	  *tmpStr2 = 0;
	  tmpIOstate = 1;
	}

      /* file residing in shared memory */

      else if(fits_strcasecmp(tmpStr3,"shmem://")        == 0)        
	{
	  *tmpStr4   = 0;
	  *tmpStr2   = 0;
	  tmpIOstate = 1;
	}
      
      /* file accessed via the ROOT network protocol */

      else if(fits_strcasecmp(tmpStr3,"root://")         == 0)         
	{
	  *tmpStr4   = 0;
	  *tmpStr2   = 0;
	  tmpIOstate = 1;
	}
  
      /*
	the next set of access types redirect the contents of the original
	file to an special outfile because the original could not be
	directly modified (i.e., resides on the network, was compressed).
	In these cases the URL string takes on the value of the OUTFILE,
	the access type becomes file://, and the iostate is set to 1 (can
	read/write to the file).
      */

      /* compressed file uncompressed and written to disk */

      else if(fits_strcasecmp(tmpStr3,"compressfile://") == 0) 
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr2,infile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"file://");
	  tmpIOstate = 1;
	}

      /* HTTP accessed file written locally to disk */

      else if(fits_strcasecmp(tmpStr3,"httpfile://")     == 0)     
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 1;
	}
      
      /* FTP accessd file written locally to disk */

      else if(fits_strcasecmp(tmpStr3,"ftpfile://")      == 0)      
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 1;
	}
      
      /* file from STDIN written to disk */

      else if(fits_strcasecmp(tmpStr3,"stdinfile://")    == 0)    
	{
	  strcpy(tmpStr1,outfile);
	  strcpy(tmpStr3,"file://");
	  strcpy(tmpStr4,"stdin://");
	  tmpIOstate = 1;
	}

      /* 
	 the following access types use memory resident files as temporary
	 storage; they cannot be modified or be made group members for 
	 grouping conventions purposes, but their original files can be.
	 Thus, their tmpStr3s are reset to mem://, their iostate
	 values are set to 0 (for no-modification), and their URL string
	 values remain set to their original values
       */

      /* compressed disk file uncompressed into memory */

      else if(fits_strcasecmp(tmpStr3,"compress://")     == 0)     
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr2,infile);
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"file://");
	  tmpIOstate = 0;
	}
      
      /* HTTP accessed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"http://")         == 0)         
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 0;
	}
      
      /* HTTP accessed compressed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"httpcompress://") == 0) 
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"http://");
	  tmpIOstate = 0;
	}
      
      /* FTP accessed file transferred into memory */
      
      else if(fits_strcasecmp(tmpStr3,"ftp://")          == 0)          
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 0;
	}
      
      /* FTP accessed compressed file transferred into memory */

      else if(fits_strcasecmp(tmpStr3,"ftpcompress://")  == 0)  
	{
	  *tmpStr1 = 0;
	  strcpy(tmpStr3,"mem://");
	  strcpy(tmpStr4,"ftp://");
	  tmpIOstate = 0;
	}	
      
      /*
	The last set of access types cannot be used to make a meaningful URL 
	strings from; thus an error is generated
       */

      else if(fits_strcasecmp(tmpStr3,"stdin://")        == 0)        
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from stdin:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      else if(fits_strcasecmp(tmpStr3,"stdout://")       == 0)       
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from stdout:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      else if(fits_strcasecmp(tmpStr3,"irafmem://")      == 0)      
	{
	  *status = URL_PARSE_ERROR;
	  ffpmsg("cannot make valid URL from irafmem:// (fits_get_url)");
	  *tmpStr1 = *tmpStr2 = 0;
	}

      if(*status != 0) continue;

      /*
	 assign values to the calling parameters if they are non-NULL
      */

      if(realURL != NULL)
	{
	  if(strlen(tmpStr1) == 0)
	    *realURL = 0;
	  else
	    {
	      if((tmpPtr = strstr(tmpStr1,"://")) != NULL)
		{
		  tmpPtr += 3;
		  i = (long)tmpPtr - (long)tmpStr1;
		  strncpy(realURL,tmpStr1,i);
		}
	      else
		{
		  tmpPtr = tmpStr1;
		  i = 0;
		}

	      *status = fits_path2url(tmpPtr,FLEN_FILENAME-i,realURL+i,status);
	    }
	}

      if(startURL != NULL)
	{
	  if(strlen(tmpStr2) == 0)
	    *startURL = 0;
	  else
	    {
	      if((tmpPtr = strstr(tmpStr2,"://")) != NULL)
		{
		  tmpPtr += 3;
		  i = (long)tmpPtr - (long)tmpStr2;
		  strncpy(startURL,tmpStr2,i);
		}
	      else
		{
		  tmpPtr = tmpStr2;
		  i = 0;
		}

	      *status = fits_path2url(tmpPtr,FLEN_FILENAME-i,startURL+i,status);
	    }
	}

      if(realAccess  != NULL)  strcpy(realAccess,tmpStr3);
      if(startAccess != NULL)  strcpy(startAccess,tmpStr4);
      if(iostate     != NULL) *iostate = tmpIOstate;

    }while(0);

  return(*status);
}